

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_stream_socket.hpp
# Opt level: O1

return_type __thiscall
asio::basic_stream_socket<asio::ip::tcp>::
async_read_some<asio::mutable_buffers_1,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,asio::ssl::detail::handshake_op,SL::WS_LITE::async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::__0>>
          (basic_stream_socket<asio::ip::tcp> *this,mutable_buffers_1 *buffers,
          io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>
          *handler)

{
  state_type sVar1;
  int iVar2;
  socket_type sVar3;
  size_t sVar4;
  undefined4 uVar5;
  mutable_buffers_1 *pmVar6;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
  *op;
  error_category *peVar7;
  thread_info_base *this_thread;
  template_rebind_alloc<reactive_socket_recv_op<mutable_buffers_1,_io_op<basic_stream_socket<tcp>,_handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>_>
  a;
  long in_FS_OFFSET;
  ptr local_58;
  reactive_socket_service<asio::ip::tcp> *local_40;
  mutable_buffers_1 *local_38;
  
  local_40 = (this->super_basic_socket<asio::ip::tcp>).
             super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
             service_;
  iVar2 = handler->start_;
  if (*(long *)(in_FS_OFFSET + -8) == 0) {
    this_thread = (thread_info_base *)0x0;
  }
  else {
    this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -8) + 8);
  }
  local_58.h = handler;
  local_38 = buffers;
  op = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
        *)detail::thread_info_base::allocate(this_thread,0x128);
  local_58.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
                *)0x0;
  sVar3 = (this->super_basic_socket<asio::ip::tcp>).
          super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
          implementation_.super_base_implementation_type.socket_;
  sVar1 = (this->super_basic_socket<asio::ip::tcp>).
          super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
          implementation_.super_base_implementation_type.state_;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.super_operation
  .next_ = (scheduler_operation *)0x0;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.super_operation
  .func_ = detail::
           reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:114:72)>_>
           ::do_complete;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.super_operation
  .task_result_ = 0;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_._M_value =
       0;
  local_58.v = op;
  peVar7 = (error_category *)std::_V2::system_category();
  pmVar6 = local_38;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_._M_cat =
       peVar7;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  bytes_transferred_ = 0;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.perform_func_ =
       detail::reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).socket_ = sVar3;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).state_ = sVar1;
  sVar4 = (local_38->super_mutable_buffer).size_;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.super_mutable_buffer.
  data_ = (local_38->super_mutable_buffer).data_;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.super_mutable_buffer.
  size_ = sVar4;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).flags_ = 0;
  (op->handler_).next_layer_ = handler->next_layer_;
  (op->handler_).core_ = handler->core_;
  (op->handler_).op_.type_ = (handler->op_).type_;
  (op->handler_).start_ = handler->start_;
  (op->handler_).want_ = handler->want_;
  uVar5 = *(undefined4 *)&(handler->ec_).field_0x4;
  peVar7 = (handler->ec_)._M_cat;
  (op->handler_).ec_._M_value = (handler->ec_)._M_value;
  *(undefined4 *)&(op->handler_).ec_.field_0x4 = uVar5;
  (op->handler_).ec_._M_cat = peVar7;
  (op->handler_).bytes_transferred_ = handler->bytes_transferred_;
  SL::WS_LITE::
  async_handshake(std::shared_ptr<SL::WS_LITE::HubContext>,std::shared_ptr<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>>,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
  ::$_0::__0((__0 *)&(op->handler_).handler_,&handler->handler_);
  local_58.p = op;
  detail::reactive_socket_service_base::start_op
            (&local_40->super_reactive_socket_service_base,
             &(this->super_basic_socket<asio::ip::tcp>).
              super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>.
              implementation_.super_base_implementation_type,0,(reactor_op *)op,iVar2 == 0,true,
             (bool)((pmVar6->super_mutable_buffer).size_ == 0 &
                   (this->super_basic_socket<asio::ip::tcp>).
                   super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>
                   .implementation_.super_base_implementation_type.state_ >> 4));
  local_58.v = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
                *)0x0;
  local_58.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:114:72)>_>
                *)0x0;
  detail::
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::ssl::detail::handshake_op,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:114:72)>_>
  ::ptr::reset(&local_58);
  return;
}

Assistant:

async_read_some(const MutableBufferSequence& buffers,
      ASIO_MOVE_ARG(ReadHandler) handler)
  {
    // If you get an error on the following line it means that your handler does
    // not meet the documented type requirements for a ReadHandler.
    ASIO_READ_HANDLER_CHECK(ReadHandler, handler) type_check;

#if defined(ASIO_ENABLE_OLD_SERVICES)
    return this->get_service().async_receive(this->get_implementation(),
        buffers, 0, ASIO_MOVE_CAST(ReadHandler)(handler));
#else // defined(ASIO_ENABLE_OLD_SERVICES)
    async_completion<ReadHandler,
      void (asio::error_code, std::size_t)> init(handler);

    this->get_service().async_receive(this->get_implementation(),
        buffers, 0, init.completion_handler);

    return init.result.get();
#endif // defined(ASIO_ENABLE_OLD_SERVICES)
  }